

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::parseAnnotation(StructuralParser *this,Annotation *annotation)

{
  bool bVar1;
  Property *pPVar2;
  Expression *o;
  Constant *o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Value local_140;
  Context local_100;
  Property local_e8;
  Property local_d8;
  char *local_c8;
  Identifier local_c0;
  UnqualifiedName *local_b8;
  UnqualifiedName *key;
  char *local_78;
  undefined1 local_60 [8];
  string name;
  Context context;
  Annotation *annotation_local;
  StructuralParser *this_local;
  
  std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>::
  clear(&annotation->properties);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"[[");
  if ((bVar1) &&
     (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e281), !bVar1)) {
    do {
      getContext((Context *)((long)&name.field_2 + 8),this);
      parseAnnotationKey_abi_cxx11_((string *)local_60,this);
      checkLength(this,(string *)local_60,0x80);
      local_78 = (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                         ::skip(&this->super_SOULTokeniser);
      pPVar2 = AST::Annotation::findProperty<std::__cxx11::string>
                         (annotation,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
      if (pPVar2 != (Property *)0x0) {
        Errors::nameInUse<std::__cxx11::string&>((CompileMessage *)&key,(Errors *)local_60,args);
        AST::Context::throwError((Context *)((long)&name.field_2 + 8),(CompileMessage *)&key,false);
      }
      local_c0 = AST::Allocator::get<std::__cxx11::string>
                           (this->allocator,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60);
      local_b8 = allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
                           (this,(Context *)((long)&name.field_2 + 8),&local_c0);
      local_c8 = ":";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x575e29);
      if (bVar1) {
        pool_ref<soul::AST::UnqualifiedName>::pool_ref<soul::AST::UnqualifiedName,void>
                  (&local_d8.name,local_b8);
        o = parseExpression(this,false);
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_d8.value,o);
        AST::Annotation::addProperty(annotation,&local_d8);
        AST::Annotation::Property::~Property(&local_d8);
      }
      else {
        pool_ref<soul::AST::UnqualifiedName>::pool_ref<soul::AST::UnqualifiedName,void>
                  (&local_e8.name,local_b8);
        getContext(&local_100,this);
        soul::Value::Value(&local_140,true);
        o_00 = allocate<soul::AST::Constant,soul::AST::Context,soul::Value>
                         (this,&local_100,&local_140);
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_e8.value,o_00);
        AST::Annotation::addProperty(annotation,&local_e8);
        AST::Annotation::Property::~Property(&local_e8);
        soul::Value::~Value(&local_140);
        AST::Context::~Context(&local_100);
      }
      std::__cxx11::string::~string((string *)local_60);
      AST::Context::~Context((Context *)((long)&name.field_2 + 8));
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    } while (bVar1);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e281);
  }
  return;
}

Assistant:

void parseAnnotation (AST::Annotation& annotation)
    {
        annotation.properties.clear();

        if (matchIf (Operator::openDoubleBracket))
        {
            if (matchIf (Operator::closeDoubleBracket))
                return;

            do
            {
                auto context = getContext();
                auto name = parseAnnotationKey();
                checkLength (name, AST::maxIdentifierLength);
                skip();

                if (annotation.findProperty (name) != nullptr)
                    context.throwError (Errors::nameInUse (name));

                auto& key = allocate<AST::UnqualifiedName> (context, allocator.get (name));

                if (matchIf (Operator::colon))
                    annotation.addProperty ({ key, parseExpression() });
                else
                    annotation.addProperty ({ key, allocate<AST::Constant> (getContext(), Value (true)) });
            }
            while (matchIf (Operator::comma));

            expect (Operator::closeDoubleBracket);
        }
    }